

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O0

void __thiscall
Disa::Matrix_Sparse::Matrix_Sparse
          (Matrix_Sparse *this,initializer_list<unsigned_long> non_zero,
          initializer_list<unsigned_long> index,initializer_list<double> value,size_t column)

{
  pointer *this_00;
  value_type vVar1;
  value_type vVar2;
  anon_class_16_2_633ba907 __comp;
  initializer_list<double> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  size_t sVar3;
  bool bVar4;
  reference pvVar5;
  ostream *poVar6;
  source_location *psVar7;
  source_location *psVar8;
  size_type sVar9;
  reference pvVar10;
  iterator __first1;
  iterator __last1;
  iterator __x;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first2;
  iterator __first1_00;
  iterator __last1_00;
  iterator __x_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first2_00;
  Matrix_Sparse *pMVar11;
  string local_518;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  undefined **local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_430;
  unsigned_long *local_428;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_420;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_418;
  string local_410;
  string local_3f0;
  string local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  undefined **local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  ulong local_2c8;
  size_t i_non_zero;
  Matrix_Sparse *local_2b8;
  unsigned_long *local_2b0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_2a8;
  unsigned_long *local_2a0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_298;
  size_type local_290;
  size_t size_non_zero;
  size_type row;
  vector<unsigned_long,_std::allocator<unsigned_long>_> org_index;
  vector<double,_std::allocator<double>_> new_value;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined **local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined **local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  unsigned_long *local_160;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_158;
  undefined **local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined **local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator<double> local_99;
  iterator local_98;
  size_type sStack_90;
  allocator<unsigned_long> local_79;
  Matrix_Sparse *local_78;
  iterator puStack_70;
  allocator<unsigned_long> local_49;
  iterator local_48;
  size_type sStack_40;
  source_location *local_38;
  size_t column_local;
  Matrix_Sparse *this_local;
  initializer_list<unsigned_long> index_local;
  initializer_list<unsigned_long> non_zero_local;
  
  index_local._M_array = (iterator)index._M_len;
  this_local = (Matrix_Sparse *)index._M_array;
  sStack_40 = non_zero._M_len;
  local_48 = non_zero._M_array;
  local_38 = (source_location *)column;
  column_local = (size_t)this;
  index_local._M_len = (size_type)local_48;
  std::allocator<unsigned_long>::allocator(&local_49);
  __l_01._M_len = sStack_40;
  __l_01._M_array = local_48;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->row_non_zero,__l_01,&local_49);
  std::allocator<unsigned_long>::~allocator(&local_49);
  local_78 = this_local;
  puStack_70 = index_local._M_array;
  std::allocator<unsigned_long>::allocator(&local_79);
  __l_00._M_len = (size_type)puStack_70;
  __l_00._M_array = (iterator)local_78;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->column_index,__l_00,&local_79);
  std::allocator<unsigned_long>::~allocator(&local_79);
  local_98 = value._M_array;
  sStack_90 = value._M_len;
  std::allocator<double>::allocator(&local_99);
  __l._M_len = sStack_90;
  __l._M_array = local_98;
  std::vector<double,_std::allocator<double>_>::vector(&this->element_value,__l,&local_99);
  std::allocator<double>::~allocator(&local_99);
  this->column_size = (size_t)local_38;
  psVar8 = local_38;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::front(&this->row_non_zero);
  if (*pvVar5 != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
    local_c8 = &PTR_s__workspace_llm4binary_github_lic_001b7c10;
    console_format_abi_cxx11_(&local_c0,(Disa *)0x0,(Log_Level)&local_c8,psVar8);
    poVar6 = std::operator<<(poVar6,(string *)&local_c0);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::front(&this->row_non_zero);
    std::__cxx11::to_string(&local_128,*pvVar5);
    std::operator+(&local_108,"First value must be zero, but is ",&local_128);
    std::operator+(&local_e8,&local_108,".");
    poVar6 = std::operator<<(poVar6,(string *)&local_e8);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_c0);
    exit(1);
  }
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->row_non_zero);
  psVar8 = (source_location *)*pvVar5;
  psVar7 = (source_location *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->column_index);
  if (psVar8 != psVar7) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
    local_150 = &PTR_s__workspace_llm4binary_github_lic_001b7c28;
    console_format_abi_cxx11_(&local_148,(Disa *)0x0,(Log_Level)&local_150,psVar7);
    poVar6 = std::operator<<(poVar6,(string *)&local_148);
    poVar6 = std::operator<<(poVar6,"Number of non-zeros does not match number of column non zeros")
    ;
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_148);
    exit(1);
  }
  local_158._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->row_non_zero);
  local_160 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->row_non_zero);
  bVar4 = std::
          is_sorted<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    (local_158,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )local_160);
  if (!bVar4) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
    local_188 = &PTR_s__workspace_llm4binary_github_lic_001b7c40;
    console_format_abi_cxx11_(&local_180,(Disa *)0x0,(Log_Level)&local_188,psVar7);
    poVar6 = std::operator<<(poVar6,(string *)&local_180);
    poVar6 = std::operator<<(poVar6,"Inconsistent non-zeros list, but be ascending.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_180);
    exit(1);
  }
  psVar8 = (source_location *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->column_index);
  psVar7 = (source_location *)std::initializer_list<double>::size(&value);
  if (psVar8 != psVar7) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
    local_1b0 = &PTR_s__workspace_llm4binary_github_lic_001b7c58;
    console_format_abi_cxx11_(&local_1a8,(Disa *)0x0,(Log_Level)&local_1b0,psVar7);
    poVar6 = std::operator<<(poVar6,(string *)&local_1a8);
    sVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->column_index);
    std::__cxx11::to_string(&local_230,sVar9);
    std::operator+(&local_210,"Mis-match in column and value size, ",&local_230);
    std::operator+(&local_1f0,&local_210," vs. ");
    sVar9 = std::initializer_list<double>::size(&value);
    std::__cxx11::to_string
              ((string *)
               &new_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,sVar9);
    std::operator+(&local_1d0,&local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &new_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    poVar6 = std::operator<<(poVar6,(string *)&local_1d0);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string
              ((string *)
               &new_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_1a8);
    exit(1);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row);
  size_non_zero = 0;
  do {
    sVar3 = size_non_zero;
    sVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->row_non_zero);
    if (sVar9 - 1 <= sVar3) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->row_non_zero,size_non_zero + 1);
    vVar2 = *pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->row_non_zero,size_non_zero);
    local_290 = vVar2 - *pvVar5;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row,local_290);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               &org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_290);
    local_298._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row);
    local_2a0 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row);
    std::
    iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
              (local_298,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )local_2a0,0);
    local_2a8._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row);
    local_2b0 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row);
    pMVar11 = (Matrix_Sparse *)&size_non_zero;
    __comp.row = (size_type *)pMVar11;
    __comp.this = this;
    i_non_zero = (size_t)this;
    local_2b8 = pMVar11;
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Disa::Matrix_Sparse::Matrix_Sparse(std::initializer_list<unsigned_long>,std::initializer_list<unsigned_long>,std::initializer_list<double>,unsigned_long)::__0>
              (local_2a8,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )local_2b0,__comp);
    for (local_2c8 = 0; local_2c8 < local_290; local_2c8 = local_2c8 + 1) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->row_non_zero,size_non_zero);
      vVar2 = *pvVar5;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row,local_2c8);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&this->element_value,vVar2 + *pvVar5);
      vVar1 = *pvVar10;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           &org_index.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,local_2c8);
      *pvVar10 = vVar1;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->row_non_zero,size_non_zero);
      vVar2 = *pvVar5;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row,local_2c8);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->column_index,vVar2 + *pvVar5);
      vVar2 = *pvVar5;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row,local_2c8);
      *pvVar5 = vVar2;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row,local_2c8);
      if (this->column_size <= *pvVar5) {
        pMVar11 = this;
        poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
        local_2f0 = &PTR_s__workspace_llm4binary_github_lic_001b7c70;
        console_format_abi_cxx11_
                  (&local_2e8,(Disa *)0x0,(Log_Level)&local_2f0,(source_location *)pMVar11);
        poVar6 = std::operator<<(poVar6,(string *)&local_2e8);
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row,local_2c8)
        ;
        std::__cxx11::to_string(&local_3d0,*pvVar5);
        std::operator+(&local_3b0,"Column index, ",&local_3d0);
        std::operator+(&local_390,&local_3b0,", in row ");
        std::__cxx11::to_string(&local_3f0,size_non_zero);
        std::operator+(&local_370,&local_390,&local_3f0);
        std::operator+(&local_350,&local_370," not in range");
        range_column_abi_cxx11_(&local_410,this);
        std::operator+(&local_330,&local_350,&local_410);
        std::operator+(&local_310,&local_330,".");
        poVar6 = std::operator<<(poVar6,(string *)&local_310);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_2e8);
        exit(1);
      }
      pMVar11 = this;
    }
    local_420._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row);
    local_428 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row);
    local_418 = std::
                adjacent_find<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                          (local_420,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )local_428);
    local_430._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row);
    bVar4 = __gnu_cxx::
            operator==<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      (&local_418,&local_430);
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
      local_458 = &PTR_s__workspace_llm4binary_github_lic_001b7c88;
      console_format_abi_cxx11_
                (&local_450,(Disa *)0x0,(Log_Level)&local_458,(source_location *)pMVar11);
      poVar6 = std::operator<<(poVar6,(string *)&local_450);
      std::__cxx11::to_string(&local_4f8,this->column_size);
      std::operator+(&local_4d8,"Duplicate column index, ",&local_4f8);
      std::operator+(&local_4b8,&local_4d8,"in row ");
      std::__cxx11::to_string(&local_518,size_non_zero);
      std::operator+(&local_498,&local_4b8,&local_518);
      std::operator+(&local_478,&local_498,".");
      poVar6 = std::operator<<(poVar6,(string *)&local_478);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_498);
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_450);
      exit(1);
    }
    this_00 = &org_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    __first1 = std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)this_00);
    __last1 = std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)this_00);
    __x = std::vector<double,_std::allocator<double>_>::begin(&this->element_value);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->row_non_zero,size_non_zero);
    __first2 = std::
               next<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                         (__x._M_current,*pvVar5);
    std::
    swap_ranges<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               __first1._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               __last1._M_current,__first2);
    __first1_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row);
    __last1_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&row);
    __x_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->column_index);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->row_non_zero,size_non_zero);
    __first2_00 = std::
                  next<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            (__x_00._M_current,*pvVar5);
    std::
    swap_ranges<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__first1_00._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__last1_00._M_current,__first2_00);
    size_non_zero = size_non_zero + 1;
  } while( true );
}

Assistant:

Matrix_Sparse::Matrix_Sparse(std::initializer_list<std::size_t> non_zero, std::initializer_list<std::size_t> index,
                             std::initializer_list<double> value, std::size_t column)
    : row_non_zero(non_zero), column_index(index), element_value(value), column_size(column) {
  ASSERT(row_non_zero.front() == 0, "First value must be zero, but is " + std::to_string(row_non_zero.front()) + ".");
  ASSERT(row_non_zero.back() == column_index.size(), "Number of non-zeros does not match number of column non zeros");
  ASSERT(std::is_sorted(row_non_zero.begin(), row_non_zero.end()), "Inconsistent non-zeros list, but be ascending.");
  ASSERT(column_index.size() == value.size(), "Mis-match in column and value size, " +
                                              std::to_string(column_index.size()) + " vs. " +
                                              std::to_string(value.size()));

  std::vector<double> new_value;
  std::vector<std::size_t> org_index;
  FOR(row, row_non_zero.size() - 1) {
    const std::size_t size_non_zero = row_non_zero[row + 1] - row_non_zero[row];
    org_index.resize(size_non_zero);
    new_value.resize(size_non_zero);
    std::iota(org_index.begin(), org_index.end(), 0);
    std::sort(org_index.begin(), org_index.end(), [&](const std::size_t index_0, const std::size_t index_1) {
      return column_index[row_non_zero[row] + index_0] < column_index[row_non_zero[row] + index_1];
    });

    FOR(i_non_zero, size_non_zero) {
      new_value[i_non_zero] = element_value[row_non_zero[row] + org_index[i_non_zero]];
      org_index[i_non_zero] = column_index[row_non_zero[row] + org_index[i_non_zero]];
      ASSERT(org_index[i_non_zero] < column_size, "Column index, " + std::to_string(org_index[i_non_zero]) +
                                                  ", in row " + std::to_string(row) + " not in range" + range_column() +
                                                  ".");
    }
    ASSERT(std::adjacent_find(org_index.begin(), org_index.end()) == org_index.end(),
           "Duplicate column index, " + std::to_string(column_size) + "in row " + std::to_string(row) + ".");
    std::swap_ranges(new_value.begin(), new_value.end(),
                     std::next(element_value.begin(), static_cast<s_size_t>(row_non_zero[row])));
    std::swap_ranges(org_index.begin(), org_index.end(),
                     std::next(column_index.begin(), static_cast<s_size_t>(row_non_zero[row])));
  }
}